

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false>::push_back
          (SmallVectorTemplateBase<std::pair<void_*,_unsigned_long>,_false> *this,
          pair<void_*,_unsigned_long> *Elt)

{
  undefined8 *puVar1;
  unsigned_long uVar2;
  uint uVar3;
  
  uVar3 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
          super_SmallVectorBase.Size;
  if ((this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
      super_SmallVectorBase.Capacity <= uVar3) {
    grow(this,0);
    uVar3 = (this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
            super_SmallVectorBase.Size;
  }
  uVar2 = Elt->second;
  puVar1 = (undefined8 *)
           ((long)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                  super_SmallVectorBase.BeginX + (ulong)uVar3 * 0x10);
  *puVar1 = Elt->first;
  puVar1[1] = uVar2;
  SmallVectorBase::set_size
            ((SmallVectorBase *)this,
             (ulong)(this->super_SmallVectorTemplateCommon<std::pair<void_*,_unsigned_long>,_void>).
                    super_SmallVectorBase.Size + 1);
  return;
}

Assistant:

void push_back(T &&Elt) {
    if (LLVM_UNLIKELY(this->size() >= this->capacity()))
      this->grow();
    ::new ((void*) this->end()) T(::std::move(Elt));
    this->set_size(this->size() + 1);
  }